

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *field)

{
  wabt *this_00;
  unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> local_68;
  wabt local_60 [8];
  wabt local_58 [8];
  wabt local_50 [8];
  wabt local_48 [8];
  wabt local_40 [8];
  wabt local_38 [8];
  wabt local_30 [8];
  wabt local_28 [8];
  wabt local_20 [8];
  wabt local_18 [8];
  
  this_00 = (wabt *)&local_68;
  switch(((field->_M_t).
          super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>._M_t.
          super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
          super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl)->type_) {
  case Func:
    this_00 = local_18;
    cast<wabt::FuncModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                      *)this_00);
    break;
  case Global:
    this_00 = local_20;
    cast<wabt::GlobalModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                      *)this_00);
    break;
  case Import:
    this_00 = local_28;
    cast<wabt::ImportModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                      *)this_00);
    break;
  case Export:
    this_00 = local_30;
    cast<wabt::ExportModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                      *)this_00);
    break;
  case Type:
    this_00 = local_38;
    cast<wabt::TypeModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                      *)this_00);
    break;
  case Table:
    this_00 = local_40;
    cast<wabt::TableModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                      *)this_00);
    break;
  case ElemSegment:
    this_00 = local_48;
    cast<wabt::ElemSegmentModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      *)this_00);
    break;
  case Memory:
    this_00 = local_50;
    cast<wabt::MemoryModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                      *)this_00);
    break;
  case DataSegment:
    this_00 = local_58;
    cast<wabt::DataSegmentModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                      *)this_00);
    break;
  case Start:
    this_00 = local_60;
    cast<wabt::StartModuleField,wabt::ModuleField>(this_00,field);
    AppendField(this,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                      *)this_00);
    break;
  case Tag:
    cast<wabt::TagModuleField,wabt::ModuleField>((wabt *)&local_68,field);
    AppendField(this,&local_68);
    break;
  default:
    goto switchD_0012f4a6_default;
  }
  if (*(long **)this_00 != (long *)0x0) {
    (**(code **)(**(long **)this_00 + 8))();
  }
switchD_0012f4a6_default:
  return;
}

Assistant:

void LocalTypes::Set(const TypeVector& types) {
  decls_.clear();
  if (types.empty()) {
    return;
  }

  Type type = types[0];
  Index count = 1;
  for (Index i = 1; i < types.size(); ++i) {
    if (types[i] != type) {
      decls_.emplace_back(type, count);
      type = types[i];
      count = 1;
    } else {
      ++count;
    }
  }
  decls_.emplace_back(type, count);
}